

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

aiColor4D Read<aiColor4t<float>>(IOStream *stream)

{
  float fVar1;
  float fVar2;
  float fVar3;
  aiColor4D aVar4;
  
  aVar4.r = Read<float>(stream);
  fVar1 = Read<float>(stream);
  fVar2 = Read<float>(stream);
  fVar3 = Read<float>(stream);
  aVar4.a = fVar3;
  aVar4.b = fVar2;
  aVar4.g = fVar1;
  return aVar4;
}

Assistant:

aiColor4D Read<aiColor4D>(IOStream * stream) {
    aiColor4D c;
    c.r = Read<float>(stream);
    c.g = Read<float>(stream);
    c.b = Read<float>(stream);
    c.a = Read<float>(stream);
    return c;
}